

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *this_00;
  pointer pMVar1;
  undefined8 this_01;
  undefined8 uVar2;
  int iVar3;
  OfType OVar4;
  undefined8 extraout_RDX;
  char cVar5;
  XmlReporter *this_02;
  MessageInfo *msg;
  pointer pMVar6;
  string local_d0;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  undefined1 local_a8 [32];
  undefined1 local_88 [64];
  StringRef local_48;
  
  iVar3 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_88._36_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  if (((char)iVar3 == '\0') &&
     ((OVar4 = (assertionStats->assertionResult).m_resultData.resultType, (OVar4 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar4 != Warning) {
      return true;
    }
    local_88._36_4_ = 0;
  }
  local_88._48_8_ = &assertionStats->assertionResult;
  pMVar1 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = &this->m_xml;
  cVar5 = (char)local_88._36_4_;
  local_88._40_8_ = this;
  local_88._56_8_ = assertionStats;
  for (pMVar6 = (assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; uVar2 = local_88._56_8_, pMVar6 != pMVar1;
      pMVar6 = pMVar6 + 1) {
    if (pMVar6->type == Info && cVar5 == '\x01') {
      std::__cxx11::string::string((string *)&local_d0,"Info",(allocator *)local_88);
      XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)this_00);
      XmlWriter::writeText((XmlWriter *)local_a8._0_8_,&pMVar6->message,true);
LAB_00127508:
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else if (pMVar6->type == Warning) {
      std::__cxx11::string::string((string *)&local_d0,"Warning",(allocator *)local_88);
      XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)this_00);
      XmlWriter::writeText((XmlWriter *)local_a8._0_8_,&pMVar6->message,true);
      goto LAB_00127508;
    }
  }
  OVar4 = *(OfType *)(local_88._56_8_ + 0xa0);
  if ((byte)((byte)local_88._36_4_ | OVar4 == Warning) != 1) {
    return true;
  }
  this_02 = (XmlReporter *)local_88._40_8_;
  if (*((StringRef *)(local_88._56_8_ + 0x30))->m_start != '\0') {
    std::__cxx11::string::string((string *)&local_d0,"Expression",&local_a9);
    this_02 = (XmlReporter *)local_88._40_8_;
    XmlWriter::startElement(this_00,&local_d0);
    std::__cxx11::string::string((string *)local_a8,"success",&local_aa);
    XmlWriter::writeAttribute
              (this_00,(string *)local_a8,(*(undefined1 *)(uVar2 + 0xa0) & FailureBit) == Ok);
    std::__cxx11::string::string((string *)local_88,"type",&local_ab);
    local_48.m_start = (((AssertionResult *)(uVar2 + 8))->m_info).macroName.m_start;
    local_48.m_size = *(size_type *)(uVar2 + 0x10);
    local_48.m_data = (char *)0x0;
    XmlWriter::writeAttribute<Catch::StringRef>
              (this_00,(string *)local_88,(StringRef *)(local_88 + 0x40));
    StringRef::~StringRef((StringRef *)(local_88 + 0x40));
    std::__cxx11::string::~string((string *)local_88);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&local_d0);
    local_d0._M_dataplus._M_p = ((SourceLineInfo *)(uVar2 + 0x20))->file;
    local_d0._M_string_length = *(size_t *)(uVar2 + 0x28);
    writeSourceInfo(this_02,(SourceLineInfo *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"Original",(allocator *)(local_88 + 0x40));
    XmlWriter::scopedElement((XmlWriter *)local_88,(string *)this_00);
    this_01 = local_88._48_8_;
    AssertionResult::getExpression_abi_cxx11_((string *)local_a8,(AssertionResult *)local_88._48_8_)
    ;
    XmlWriter::writeText((XmlWriter *)local_88._0_8_,(string *)local_a8,true);
    std::__cxx11::string::~string((string *)local_a8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"Expanded",(allocator *)(local_88 + 0x40));
    XmlWriter::scopedElement((XmlWriter *)local_88,(string *)this_00);
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_a8,(AssertionResult *)this_01)
    ;
    XmlWriter::writeText((XmlWriter *)local_88._0_8_,(string *)local_a8,true);
    std::__cxx11::string::~string((string *)local_a8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
    std::__cxx11::string::~string((string *)&local_d0);
    OVar4 = *(OfType *)(uVar2 + 0xa0);
  }
  if (OVar4 == Info) {
    std::__cxx11::string::string((string *)&local_d0,"Info",(allocator *)(local_88 + 0x40));
    XmlWriter::scopedElement((XmlWriter *)local_88,(string *)this_00);
    std::__cxx11::string::string((string *)local_a8,(string *)(uVar2 + 0x50));
    XmlWriter::writeText((XmlWriter *)local_88._0_8_,(string *)local_a8,true);
    std::__cxx11::string::~string((string *)local_a8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_88);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    if (OVar4 == ExplicitFailure) {
      std::__cxx11::string::string((string *)&local_d0,"Failure",(allocator *)local_a8);
      XmlWriter::startElement(this_00,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      local_d0._M_dataplus._M_p = ((SourceLineInfo *)(uVar2 + 0x20))->file;
      local_d0._M_string_length = *(size_t *)(uVar2 + 0x28);
      writeSourceInfo(this_02,(SourceLineInfo *)&local_d0);
      std::__cxx11::string::string((string *)&local_d0,(string *)(uVar2 + 0x50));
      XmlWriter::writeText(this_00,&local_d0,true);
    }
    else if (OVar4 == FatalErrorCondition) {
      std::__cxx11::string::string((string *)&local_d0,"FatalErrorCondition",(allocator *)local_a8);
      XmlWriter::startElement(this_00,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      local_d0._M_dataplus._M_p = ((SourceLineInfo *)(uVar2 + 0x20))->file;
      local_d0._M_string_length = *(size_t *)(uVar2 + 0x28);
      writeSourceInfo(this_02,(SourceLineInfo *)&local_d0);
      std::__cxx11::string::string((string *)&local_d0,(string *)(uVar2 + 0x50));
      XmlWriter::writeText(this_00,&local_d0,true);
    }
    else {
      if (OVar4 != ThrewException) goto LAB_001278e9;
      std::__cxx11::string::string((string *)&local_d0,"Exception",(allocator *)local_a8);
      XmlWriter::startElement(this_00,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      local_d0._M_dataplus._M_p = ((SourceLineInfo *)(uVar2 + 0x20))->file;
      local_d0._M_string_length = *(size_t *)(uVar2 + 0x28);
      writeSourceInfo(this_02,(SourceLineInfo *)&local_d0);
      std::__cxx11::string::string((string *)&local_d0,(string *)(uVar2 + 0x50));
      XmlWriter::writeText(this_00,&local_d0,true);
    }
    std::__cxx11::string::~string((string *)&local_d0);
    XmlWriter::endElement(this_00);
  }
LAB_001278e9:
  if (*((StringRef *)(uVar2 + 0x30))->m_start != '\0') {
    XmlWriter::endElement(this_00);
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }